

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O0

int64_t file_seek(archive *a,void *client_data,int64_t request,wchar_t whence)

{
  uint *puVar1;
  int in_ECX;
  __off_t in_RDX;
  int *in_RSI;
  archive *in_RDI;
  int64_t r;
  read_file_data *mine;
  __off_t local_8;
  
  local_8 = lseek(*in_RSI,in_RDX,in_ECX);
  if (local_8 < 0) {
    if (in_RSI[8] == 0) {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Error seeking in stdin");
    }
    else if (in_RSI[8] == 1) {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Error seeking in \'%s\'",in_RSI + 9);
    }
    else {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Error seeking in \'%S\'",in_RSI + 9);
    }
    local_8 = -0x1e;
  }
  return local_8;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *data, int64_t request, int whence)
{
  struct mydata *mine = (struct mydata *)data;
  int64_t r;

  (void)a;
  r = lseek(mine->fd, request, whence);
  if (r >= 0)
    return r;
  return (ARCHIVE_FATAL);
}